

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O2

string * __thiscall
flatbuffers::GetAnyFieldS_abi_cxx11_
          (string *__return_storage_ptr__,flatbuffers *this,Table *table,Field *field,Schema *schema
          )

{
  uint16_t field_00;
  BaseType BVar1;
  uint8_t *puVar2;
  Type *pTVar3;
  char *pcVar4;
  int __c;
  int in_R9D;
  allocator<char> local_29;
  
  field_00 = reflection::Field::offset((Field *)table);
  pcVar4 = (char *)(ulong)field_00;
  puVar2 = Table::GetAddressOf((Table *)this,field_00);
  if (puVar2 == (uint8_t *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_29);
  }
  else {
    pTVar3 = reflection::Field::type((Field *)table);
    BVar1 = reflection::Type::base_type(pTVar3);
    pTVar3 = reflection::Field::type((Field *)table);
    pcVar4 = reflection::Type::index(pTVar3,pcVar4,__c);
    GetAnyValueS_abi_cxx11_
              (__return_storage_ptr__,(flatbuffers *)(ulong)BVar1,(BaseType)puVar2,(uint8_t *)field,
               (Schema *)((ulong)pcVar4 & 0xffffffff),in_R9D);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string GetAnyFieldS(const Table &table,
                                const reflection::Field &field,
                                const reflection::Schema *schema) {
  auto field_ptr = table.GetAddressOf(field.offset());
  return field_ptr ? GetAnyValueS(field.type()->base_type(), field_ptr, schema,
                                  field.type()->index())
                   : "";
}